

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::AddProperty
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyRecord *propertyRecord,Var value,PropertyAttributes attributes,
          PropertyValueInfo *info,PropertyOperationFlags flags,bool throwIfNotExtensible,
          SideEffects possibleSideEffects)

{
  code *pcVar1;
  Type this_00;
  PropertyRecord *instance_00;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  BOOL BVar6;
  PropertyId PVar7;
  undefined4 *puVar8;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar9;
  RecyclerWeakReference<Js::DynamicObject> **ppRVar10;
  RecyclerWeakReference<Js::DynamicObject> *this_01;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_02;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *this_03;
  JavascriptLibrary *local_c0;
  undefined1 local_98 [16];
  Type local_88;
  JavascriptLibrary *library;
  DynamicObject *localSingletonInstance;
  DictionaryPropertyDescriptor<unsigned_short> newDescriptor;
  unsigned_short index;
  BigDictionaryTypeHandler *newTypeHandler;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  PropertyId propertyId;
  bool isForce;
  ScriptContext *scriptContext;
  Type TStack_40;
  bool throwIfNotExtensible_local;
  PropertyValueInfo *info_local;
  Type TStack_30;
  PropertyAttributes attributes_local;
  Var value_local;
  PropertyRecord *propertyRecord_local;
  DynamicObject *instance_local;
  DictionaryTypeHandlerBase<unsigned_short> *this_local;
  
  scriptContext._7_1_ = throwIfNotExtensible;
  TStack_40.ptr = (RuntimeFunction *)info;
  info_local._7_1_ = attributes;
  TStack_30.ptr = (RuntimeFunction *)value;
  value_local = propertyRecord;
  propertyRecord_local = (PropertyRecord *)instance;
  instance_local = (DynamicObject *)this;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x862,"(instance)","instance");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  _propertyId = (RuntimeFunction *)
                RecyclableObject::GetScriptContext((RecyclableObject *)propertyRecord_local);
  descriptor._7_1_ = (flags & PropertyOperation_Force) != PropertyOperation_None;
  descriptor._0_4_ = PropertyRecord::GetPropertyId((PropertyRecord *)value_local);
  pBVar9 = Memory::
           WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
           ::operator->(&this->propertyMap);
  bVar2 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)pBVar9,(PropertyRecord **)&value_local,
                     (DictionaryPropertyDescriptor<unsigned_short> **)&newTypeHandler);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x868,
                                "(!propertyMap->TryGetReference(propertyRecord, &descriptor))",
                                "!propertyMap->TryGetReference(propertyRecord, &descriptor)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  bVar2 = PropertyRecord::IsNumeric((PropertyRecord *)value_local);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x869,"(!propertyRecord->IsNumeric())",
                                "!propertyRecord->IsNumeric()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if (((descriptor._7_1_ & 1) != 0) ||
     (bVar2 = DynamicTypeHandler::VerifyIsExtensible
                        (&this->super_DynamicTypeHandler,(ScriptContext *)_propertyId,
                         (bool)(scriptContext._7_1_ & 1)), bVar2)) {
    iVar5 = DynamicTypeHandler::GetSlotCapacity(&this->super_DynamicTypeHandler);
    if (iVar5 <= (int)(uint)this->nextPropertyIndex) {
      iVar5 = DynamicTypeHandler::GetSlotCapacity(&this->super_DynamicTypeHandler);
      if ((0xfffd < iVar5) ||
         ((iVar5 = DynamicTypeHandler::GetSlotCapacity(&this->super_DynamicTypeHandler),
          _DAT_01eca2a0 <= iVar5 && (BVar6 = IsBigDictionaryTypeHandler(this), BVar6 == 0)))) {
        register0x00000000 =
             (RuntimeFunction *)
             ConvertToBigDictionaryTypeHandler(this,(DynamicObject *)propertyRecord_local);
        BVar6 = DictionaryTypeHandlerBase<int>::AddProperty
                          ((DictionaryTypeHandlerBase<int> *)register0x00000000,
                           (DynamicObject *)propertyRecord_local,(PropertyRecord *)value_local,
                           TStack_30.ptr,info_local._7_1_,(PropertyValueInfo *)TStack_40.ptr,flags,
                           false,possibleSideEffects);
        return BVar6;
      }
      EnsureSlotCapacity(this,(DynamicObject *)propertyRecord_local,1);
    }
    newDescriptor._0_2_ = ::Math::PostInc<unsigned_short>(&this->nextPropertyIndex);
    DictionaryPropertyDescriptor<unsigned_short>::DictionaryPropertyDescriptor
              ((DictionaryPropertyDescriptor<unsigned_short> *)((long)&localSingletonInstance + 6),
               newDescriptor._0_2_,info_local._7_1_,false,false,false);
    bVar2 = DynamicTypeHandler::GetIsOrMayBecomeShared(&this->super_DynamicTypeHandler);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x884,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    ppRVar10 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                         ((WriteBarrierPtr *)&this->singletonInstance);
    if (*ppRVar10 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      local_c0 = (JavascriptLibrary *)0x0;
    }
    else {
      this_01 = Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::
                operator->(&this->singletonInstance);
      local_c0 = (JavascriptLibrary *)Memory::RecyclerWeakReference<Js::DynamicObject>::Get(this_01)
      ;
    }
    library = local_c0;
    ppRVar10 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                         ((WriteBarrierPtr *)&this->singletonInstance);
    if ((*ppRVar10 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
       (library != (JavascriptLibrary *)propertyRecord_local)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x887,
                                  "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                  ,
                                  "this->singletonInstance == nullptr || localSingletonInstance == instance"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    if (((((flags & PropertyOperation_PreInit) == PropertyOperation_None) &&
         (DictionaryPropertyDescriptor<unsigned_short>::SetIsInitialized
                    ((DictionaryPropertyDescriptor<unsigned_short> *)
                     ((long)&localSingletonInstance + 6),true),
         library == (JavascriptLibrary *)propertyRecord_local)) &&
        (BVar6 = IsInternalPropertyId((PropertyId)descriptor), BVar6 == 0)) &&
       ((flags & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
        PropertyOperation_None)) {
      if (TStack_30.ptr == (RuntimeFunction *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x88f,"(value != nullptr)","value != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      BVar6 = RecyclableObject::IsExternal((RecyclableObject *)propertyRecord_local);
      if (BVar6 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x891,"(!instance->IsExternal())","!instance->IsExternal()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      bVar2 = VarIs<Js::JavascriptFunction>(TStack_30.ptr);
      if (bVar2) {
        bVar2 = DynamicTypeHandler::ShouldFixMethodProperties();
      }
      else {
        bVar2 = DynamicTypeHandler::ShouldFixDataProperties();
        bVar3 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps
                          ((DynamicObject *)propertyRecord_local,(PropertyRecord *)value_local,
                           TStack_30.ptr);
        bVar2 = bVar2 && bVar3;
      }
      DictionaryPropertyDescriptor<unsigned_short>::SetIsFixed
                ((DictionaryPropertyDescriptor<unsigned_short> *)((long)&localSingletonInstance + 6)
                 ,bVar2 != false);
    }
    pBVar9 = Memory::
             WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
             ::operator->(&this->propertyMap);
    JsUtil::
    BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Add(pBVar9,(PropertyRecord **)&value_local,
          (DictionaryPropertyDescriptor<unsigned_short> *)((long)&localSingletonInstance + 6));
    if ((info_local._7_1_ & 1) != 0) {
      DynamicObject::SetHasNoEnumerableProperties((DynamicObject *)propertyRecord_local,false);
    }
    local_88.ptr = (RuntimeFunction *)ScriptContext::GetLibrary(_propertyId);
    JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
              ((JavascriptLibrary *)(local_98 + 8));
    this_02 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
              operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *
                         )(local_98 + 8));
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<int>
              (this_02,&this->super_DynamicTypeHandler,info_local._7_1_,(PropertyId)descriptor,
               (ScriptContext *)_propertyId);
    bVar2 = NoSpecialPropertyCache::IsSpecialProperty((PropertyId)descriptor);
    if ((bVar2) &&
       (bVar2 = DynamicTypeHandler::GetHasSpecialProperties(&this->super_DynamicTypeHandler), !bVar2
       )) {
      bVar2 = NoSpecialPropertyCache::IsDefaultSpecialProperty
                        ((DynamicObject *)propertyRecord_local,(JavascriptLibrary *)local_88.ptr,
                         (PropertyId)descriptor);
      if (bVar2) {
        PropertyValueInfo::SetNoCache
                  ((PropertyValueInfo *)TStack_40.ptr,(RecyclableObject *)propertyRecord_local);
      }
      else {
        DynamicTypeHandler::SetHasSpecialProperties(&this->super_DynamicTypeHandler);
        bVar4 = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
        if ((bVar4 & 0x20) != 0) {
          JavascriptLibrary::GetTypesWithNoSpecialPropertyProtoChainCache
                    ((JavascriptLibrary *)local_98);
          this_03 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::
                    operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>
                                *)local_98);
          PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(this_03);
        }
      }
    }
    DynamicTypeHandler::SetSlotUnchecked
              ((DynamicObject *)propertyRecord_local,(uint)(ushort)newDescriptor._0_2_,TStack_30.ptr
              );
    bVar2 = DictionaryPropertyDescriptor<unsigned_short>::GetIsFixed
                      ((DictionaryPropertyDescriptor<unsigned_short> *)
                       ((long)&localSingletonInstance + 6));
    if (bVar2) {
      PropertyValueInfo::SetNoCache
                ((PropertyValueInfo *)TStack_40.ptr,(RecyclableObject *)propertyRecord_local);
    }
    else {
      SetPropertyValueInfoNonFixed
                (this,(PropertyValueInfo *)TStack_40.ptr,(RecyclableObject *)propertyRecord_local,
                 newDescriptor._0_2_,info_local._7_1_,InlineCacheNoFlags);
    }
    this_00.ptr = _propertyId;
    PVar7 = PropertyRecord::GetPropertyId((PropertyRecord *)value_local);
    ScriptContext::InvalidateProtoCaches((ScriptContext *)this_00.ptr,PVar7);
    instance_00 = propertyRecord_local;
    PVar7 = PropertyRecord::GetPropertyId((PropertyRecord *)value_local);
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,(DynamicObject *)instance_00,PVar7,TStack_30.ptr,
               possibleSideEffects);
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::AddProperty(DynamicObject* instance, const PropertyRecord* propertyRecord, Var value,
        PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, bool throwIfNotExtensible, SideEffects possibleSideEffects)
    {
        AnalysisAssert(instance);
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool isForce = (flags & PropertyOperation_Force) != 0;
        PropertyId propertyId = propertyRecord->GetPropertyId();
#if DBG
        DictionaryPropertyDescriptor<T>* descriptor;
        Assert(!propertyMap->TryGetReference(propertyRecord, &descriptor));
        Assert(!propertyRecord->IsNumeric());
#endif

        if (!isForce)
        {
            if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
            {
                return FALSE;
            }
        }

        if (this->GetSlotCapacity() <= nextPropertyIndex)
        {
            if (this->GetSlotCapacity() >= MaxPropertyIndexSize ||
                (this->GetSlotCapacity() >= CONFIG_FLAG(BigDictionaryTypeHandlerThreshold) && !this->IsBigDictionaryTypeHandler()))
            {
                BigDictionaryTypeHandler* newTypeHandler = ConvertToBigDictionaryTypeHandler(instance);

                return newTypeHandler->AddProperty(instance, propertyRecord, value, attributes, info, flags, false, possibleSideEffects);
            }
            this->EnsureSlotCapacity(instance);
        }

        T index = ::Math::PostInc(nextPropertyIndex);
        DictionaryPropertyDescriptor<T> newDescriptor(index, attributes);

        // DictionaryTypeHandlers are not supposed to be shared.
        Assert(!GetIsOrMayBecomeShared());
#if ENABLE_FIXED_FIELDS
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);

        if ((flags & PropertyOperation_PreInit) == 0)
        {
            newDescriptor.SetIsInitialized(true);
            if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId) &&
                (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
            {
                Assert(value != nullptr);
                // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                Assert(!instance->IsExternal());
                newDescriptor.SetIsFixed(VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() & CheckHeuristicsForFixedDataProps(instance, propertyRecord, value)));
            }
        }
#endif

        propertyMap->Add(propertyRecord, newDescriptor);

        if (attributes & PropertyEnumerable)
        {
            instance->SetHasNoEnumerableProperties(false);
        }
        JavascriptLibrary* library = scriptContext->GetLibrary();

        library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyId, scriptContext);
        if (NoSpecialPropertyCache::IsSpecialProperty(propertyId) && !this->GetHasSpecialProperties())
        {
            if (!NoSpecialPropertyCache::IsDefaultSpecialProperty(instance, library, propertyId))
            {
                this->SetHasSpecialProperties();
                if (GetFlags() & IsPrototypeFlag)
                {
                    library->GetTypesWithNoSpecialPropertyProtoChainCache()->Clear();
                }
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }

        SetSlotUnchecked(instance, index, value);

#if ENABLE_FIXED_FIELDS
        // If we just added a fixed method, don't populate the inline cache so that we always take the
        // slow path when overwriting this property and correctly invalidate any JIT-ed code that hard-coded
        // this method.
        if (newDescriptor.GetIsFixed())
        {
            PropertyValueInfo::SetNoCache(info, instance);
        }
        else
#endif
        {
            SetPropertyValueInfoNonFixed(info, instance, index, attributes);
        }

        // Always invalidate prototype caches when we add a property.  Previously, we only did this if the current
        // type is used as a prototype, or if the new property is also found on the prototype chain (because
        // adding a new field doesn't create a new dictionary type).  However, if the new property is already in
        // the cache as a missing property, we have to invalidate the prototype caches.
        scriptContext->InvalidateProtoCaches(propertyRecord->GetPropertyId());

        SetPropertyUpdateSideEffect(instance, propertyRecord->GetPropertyId(), value, possibleSideEffects);
        return true;
    }